

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmComputeTargetDepends.cxx
# Opt level: O1

void __thiscall cmComputeTargetDepends::CollectTargets(cmComputeTargetDepends *this)

{
  pointer *pppcVar1;
  pointer ppcVar2;
  pointer ppcVar3;
  iterator __position;
  pointer ppcVar4;
  mapped_type_conflict *pmVar5;
  ulong uVar6;
  _Hash_node_base *p_Var7;
  cmTarget *target;
  cmTarget *local_48;
  cmGlobalGenerator *local_40;
  vector<cmTarget_const*,std::allocator<cmTarget_const*>> *local_38;
  
  local_40 = this->GlobalGenerator;
  ppcVar4 = (local_40->LocalGenerators).
            super__Vector_base<cmLocalGenerator_*,_std::allocator<cmLocalGenerator_*>_>._M_impl.
            super__Vector_impl_data._M_start;
  if ((local_40->LocalGenerators).
      super__Vector_base<cmLocalGenerator_*,_std::allocator<cmLocalGenerator_*>_>._M_impl.
      super__Vector_impl_data._M_finish != ppcVar4) {
    local_38 = (vector<cmTarget_const*,std::allocator<cmTarget_const*>> *)&this->Targets;
    uVar6 = 0;
    do {
      for (p_Var7 = (ppcVar4[uVar6]->Makefile->Targets)._M_h._M_before_begin._M_nxt;
          p_Var7 != (_Hash_node_base *)0x0; p_Var7 = p_Var7->_M_nxt) {
        local_48 = (cmTarget *)(p_Var7 + 5);
        ppcVar2 = (this->Targets).
                  super__Vector_base<const_cmTarget_*,_std::allocator<const_cmTarget_*>_>._M_impl.
                  super__Vector_impl_data._M_finish;
        ppcVar3 = (this->Targets).
                  super__Vector_base<const_cmTarget_*,_std::allocator<const_cmTarget_*>_>._M_impl.
                  super__Vector_impl_data._M_start;
        pmVar5 = std::
                 map<const_cmTarget_*,_int,_std::less<const_cmTarget_*>,_std::allocator<std::pair<const_cmTarget_*const,_int>_>_>
                 ::operator[](&this->TargetIndex,&local_48);
        *pmVar5 = (mapped_type_conflict)((ulong)((long)ppcVar2 - (long)ppcVar3) >> 3);
        __position._M_current =
             (this->Targets).super__Vector_base<const_cmTarget_*,_std::allocator<const_cmTarget_*>_>
             ._M_impl.super__Vector_impl_data._M_finish;
        if (__position._M_current ==
            (this->Targets).super__Vector_base<const_cmTarget_*,_std::allocator<const_cmTarget_*>_>.
            _M_impl.super__Vector_impl_data._M_end_of_storage) {
          std::vector<cmTarget_const*,std::allocator<cmTarget_const*>>::
          _M_realloc_insert<cmTarget_const*const&>(local_38,__position,&local_48);
        }
        else {
          *__position._M_current = local_48;
          pppcVar1 = &(this->Targets).
                      super__Vector_base<const_cmTarget_*,_std::allocator<const_cmTarget_*>_>.
                      _M_impl.super__Vector_impl_data._M_finish;
          *pppcVar1 = *pppcVar1 + 1;
        }
      }
      uVar6 = (ulong)((int)uVar6 + 1);
      ppcVar4 = (local_40->LocalGenerators).
                super__Vector_base<cmLocalGenerator_*,_std::allocator<cmLocalGenerator_*>_>._M_impl.
                super__Vector_impl_data._M_start;
    } while (uVar6 < (ulong)((long)(local_40->LocalGenerators).
                                   super__Vector_base<cmLocalGenerator_*,_std::allocator<cmLocalGenerator_*>_>
                                   ._M_impl.super__Vector_impl_data._M_finish - (long)ppcVar4 >> 3))
    ;
  }
  return;
}

Assistant:

void cmComputeTargetDepends::CollectTargets()
{
  // Collect all targets from all generators.
  std::vector<cmLocalGenerator*> const& lgens =
    this->GlobalGenerator->GetLocalGenerators();
  for(unsigned int i = 0; i < lgens.size(); ++i)
    {
    const cmTargets& targets = lgens[i]->GetMakefile()->GetTargets();
    for(cmTargets::const_iterator ti = targets.begin();
        ti != targets.end(); ++ti)
      {
      cmTarget const* target = &ti->second;
      int index = static_cast<int>(this->Targets.size());
      this->TargetIndex[target] = index;
      this->Targets.push_back(target);
      }
    }
}